

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_MessageBook.cpp
# Opt level: O0

PersonHandle * __thiscall
mbc::Val::MessageBook::sreach
          (PersonHandle *__return_storage_ptr__,MessageBook *this,string *thing,string *attr_)

{
  anon_class_16_2_9d227009_for__M_pred __pred;
  bool bVar1;
  pointer ppVar2;
  _Self local_58;
  string *local_50;
  string *local_48;
  _Base_ptr local_40;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>
  local_38;
  _Self local_30;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>
  it;
  string *attr__local;
  string *thing_local;
  MessageBook *this_local;
  
  it._M_node = (_Base_ptr)attr_;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
       ::begin(this->persons_);
  local_40 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
             ::end(this->persons_);
  __pred.thing = thing;
  __pred.attr_ = attr_;
  local_50 = attr_;
  local_48 = thing;
  local_30._M_node =
       (_Base_ptr)
       std::
       find_if<std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,mbc::Val::MessageBook::sreach(std::__cxx11::string,std::__cxx11::string)::__0>
                 (local_38,(_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>
                            )local_40,__pred);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
       ::end(this->persons_);
  bVar1 = std::operator!=(&local_30,&local_58);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>
             ::operator->(&local_30);
    PersonHandle::PersonHandle(__return_storage_ptr__,this,ppVar2->second);
  }
  else {
    newPerson(__return_storage_ptr__,this);
  }
  return __return_storage_ptr__;
}

Assistant:

PersonHandle MessageBook::sreach(string thing, string attr_) {
    auto it = std::find_if(persons_ -> begin(), persons_ -> end(),
            [&](const std::pair<string, Person*>& pair) {
                return pair.second -> attr(attr_) -> raw() == thing;
            });
    if(it != persons_ -> end()) {
        return PersonHandle(this, it -> second);
    } else {
        return newPerson();
        // throw "the result of sreach is too little";
    }
}